

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_insertBlock(ZSTD_DCtx *dctx,void *blockStart,size_t blockSize)

{
  size_t in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  
  ZSTD_checkContinuity(in_RDI,in_RSI,in_RDX);
  in_RDI->previousDstEnd = (void *)((long)in_RSI + in_RDX);
  return in_RDX;
}

Assistant:

size_t ZSTD_insertBlock(ZSTD_DCtx* dctx, const void* blockStart, size_t blockSize)
{
    DEBUGLOG(5, "ZSTD_insertBlock: %u bytes", (unsigned)blockSize);
    ZSTD_checkContinuity(dctx, blockStart, blockSize);
    dctx->previousDstEnd = (const char*)blockStart + blockSize;
    return blockSize;
}